

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QByteArray>::eraseLast(QGenericArrayOps<QByteArray> *this)

{
  QArrayDataPointer<QByteArray> *in_RDI;
  
  QArrayDataPointer<QByteArray>::end(in_RDI);
  QByteArray::~QByteArray((QByteArray *)0x1647e8);
  in_RDI->size = in_RDI->size + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }